

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text_format.cc
# Opt level: O1

bool __thiscall google::protobuf::TextFormat::Parser::ParserImpl::SkipField(ParserImpl *this)

{
  size_type *psVar1;
  size_t sVar2;
  bool bVar3;
  bool bVar4;
  int iVar5;
  bool bVar6;
  undefined1 *local_b0;
  size_t local_a8;
  undefined1 local_a0 [16];
  string local_90;
  undefined1 *local_70;
  size_t local_68;
  undefined1 local_60 [16];
  undefined1 local_50 [8];
  string field_name;
  
  psVar1 = &field_name._M_string_length;
  local_50 = (undefined1  [8])psVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_50,"[","");
  bVar4 = TryConsume(this,(string *)local_50);
  if (local_50 != (undefined1  [8])psVar1) {
    operator_delete((void *)local_50);
  }
  if (bVar4) {
    bVar4 = ConsumeTypeUrlOrFullTypeName(this);
    if (!bVar4) {
      return false;
    }
    local_50 = (undefined1  [8])psVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_50,"]","");
    bVar4 = Consume(this,(string *)local_50);
  }
  else {
    field_name._M_dataplus._M_p = (pointer)0x0;
    field_name._M_string_length._0_1_ = 0;
    local_50 = (undefined1  [8])psVar1;
    bVar4 = ConsumeIdentifier(this,(string *)local_50);
  }
  if (local_50 != (undefined1  [8])psVar1) {
    operator_delete((void *)local_50);
  }
  if (bVar4 == false) {
    return false;
  }
  local_50 = (undefined1  [8])psVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_50,":","");
  bVar4 = TryConsume(this,(string *)local_50);
  if (bVar4) {
    local_70 = local_60;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"{","");
    sVar2 = (this->tokenizer_).current_.text._M_string_length;
    if ((sVar2 == local_68) &&
       ((sVar2 == 0 ||
        (iVar5 = bcmp((this->tokenizer_).current_.text._M_dataplus._M_p,local_70,sVar2), iVar5 == 0)
        ))) goto LAB_002feeac;
    local_b0 = local_a0;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_b0,"<","");
    sVar2 = (this->tokenizer_).current_.text._M_string_length;
    bVar3 = true;
    if (sVar2 != local_a8) {
      bVar6 = true;
      goto LAB_002feeb2;
    }
    bVar6 = true;
    if (sVar2 != 0) {
      iVar5 = bcmp((this->tokenizer_).current_.text._M_dataplus._M_p,local_b0,sVar2);
      bVar6 = iVar5 != 0;
      goto LAB_002feeb2;
    }
  }
  else {
LAB_002feeac:
    bVar6 = false;
  }
  bVar3 = bVar6;
  bVar6 = false;
LAB_002feeb2:
  if ((bVar3) && (local_b0 != local_a0)) {
    operator_delete(local_b0);
  }
  if ((bVar4) && (local_70 != local_60)) {
    operator_delete(local_70);
  }
  if (local_50 != (undefined1  [8])psVar1) {
    operator_delete((void *)local_50);
  }
  if (bVar6) {
    bVar4 = SkipFieldValue(this);
  }
  else {
    bVar4 = SkipFieldMessage(this);
  }
  if (bVar4 == false) {
    return false;
  }
  local_50 = (undefined1  [8])psVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_50,";","");
  bVar4 = TryConsume(this,(string *)local_50);
  if (!bVar4) {
    local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,",","");
    TryConsume(this,&local_90);
    if ((!bVar4) &&
       ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_90._M_dataplus._M_p != &local_90.field_2)) {
      operator_delete(local_90._M_dataplus._M_p);
    }
  }
  if (local_50 != (undefined1  [8])psVar1) {
    operator_delete((void *)local_50);
  }
  return true;
}

Assistant:

bool SkipField() {
    if (TryConsume("[")) {
      // Extension name or type URL.
      DO(ConsumeTypeUrlOrFullTypeName());
      DO(Consume("]"));
    } else {
      std::string field_name;
      DO(ConsumeIdentifier(&field_name));
    }

    // Try to guess the type of this field.
    // If this field is not a message, there should be a ":" between the
    // field name and the field value and also the field value should not
    // start with "{" or "<" which indicates the beginning of a message body.
    // If there is no ":" or there is a "{" or "<" after ":", this field has
    // to be a message or the input is ill-formed.
    if (TryConsume(":") && !LookingAt("{") && !LookingAt("<")) {
      DO(SkipFieldValue());
    } else {
      DO(SkipFieldMessage());
    }
    // For historical reasons, fields may optionally be separated by commas or
    // semicolons.
    TryConsume(";") || TryConsume(",");
    return true;
  }